

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_errors_in_accept(void)

{
  cio_error cVar1;
  undefined4 extraout_var;
  cio_inet_address *arg1;
  cio_timer_close_hook_t extraout_RDX;
  cio_eventloop *__src;
  cio_socket *pcVar2;
  undefined1 local_260 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  _func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t *timer_init_fakes [2];
  accept_test accept_test;
  uint i;
  
  for (accept_test.request._4_4_ = 0; accept_test.request._4_4_ < 8;
      accept_test.request._4_4_ = accept_test.request._4_4_ + 1) {
    __src = (cio_eventloop *)(test_errors_in_accept::accept_tests + accept_test.request._4_4_);
    memcpy(timer_init_fakes + 1,__src,0x38);
    cio_server_socket_accept_fake.custom_fake =
         (_func_cio_error_cio_server_socket_ptr_cio_accept_handler_t_void_ptr *)accept_test._32_8_;
    pcVar2 = client_socket;
    free_dummy_client(client_socket);
    cVar1 = (*timer_init_fakes[1])((cio_timer *)pcVar2,__src,extraout_RDX);
    client_socket = (cio_socket *)CONCAT44(extraout_var,cVar1);
    cio_timer_init_fake.custom_fake =
         (_func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t *)0x0;
    cio_timer_init_fake.custom_fake_seq =
         (_func_cio_error_cio_timer_ptr_cio_eventloop_ptr_cio_timer_close_hook_t **)
         &config.free_client;
    cio_timer_init_fake.custom_fake_seq_len = 2;
    cio_timer_expires_from_now_fake.custom_fake =
         (_func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr *)
         accept_test.request_timer_init;
    cio_buffered_stream_init_fake.return_val = (cio_error)accept_test.timer_expires;
    memset(server.keepalive_header + 0x20,0,0x74);
    config._112_8_ = serve_error;
    config.on_error = (cio_http_serve_on_error_t)0x12a05f200;
    config.read_header_timeout_ns = 5000000000;
    config.read_body_timeout_ns = 5000000000;
    config.response_timeout_ns = 10;
    config.close_timeout_ns._0_1_ = 0;
    config._160_8_ = timer_init_fakes[1];
    config.alloc_client = free_dummy_client;
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90)
    ;
    cVar1 = cio_http_server_init
                      ((cio_http_server *)local_260,&loop,
                       (cio_http_server_configuration *)(server.keepalive_header + 0x20));
    UnityAssertEqualNumber
              (0,(long)cVar1,"Server initialization failed!",0x6b7,UNITY_DISPLAY_STYLE_INT);
    split_request((char *)accept_test.accept_handler);
    cVar1 = cio_http_server_serve((cio_http_server *)local_260);
    UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x6bb,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x6bc,
               UNITY_DISPLAY_STYLE_INT);
    if (timer_init_fakes[1] != alloc_dummy_client_no_iostream) {
      UnityAssertEqualNumber
                (1,(ulong)stream_close_fake.call_count,"stream was not closed!",0x6bf,
                 UNITY_DISPLAY_STYLE_INT);
    }
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_errors_in_accept(void)
{
	struct accept_test {
		struct cio_socket *(*alloc_client)(void);
		enum cio_error (*response_timer_init)(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook);
		enum cio_error (*request_timer_init)(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook);
		enum cio_error (*timer_expires)(struct cio_timer *t, uint64_t timeout_ns, cio_timer_handler_t handler, void *handler_context);
		enum cio_error buffered_stream_init_return_val;
		enum cio_error (*accept_handler)(struct cio_server_socket *ss, cio_accept_handler_t handler, void *handler_context);

		const char *request;
	};

	static const struct accept_test accept_tests[] = {
	    {.accept_handler = accept_error_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_NO_MEMORY,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client_no_buffer,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client_no_iostream,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_error_handler,
	     .alloc_client = alloc_dummy_client_no_iostream,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_fails,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_fails,
	     .timer_expires = expires,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	    {.accept_handler = accept_call_handler,
	     .alloc_client = alloc_dummy_client,
	     .response_timer_init = cio_timer_init_ok,
	     .request_timer_init = cio_timer_init_ok,
	     .timer_expires = expires_error,
	     .buffered_stream_init_return_val = CIO_SUCCESS,
	     .request = "GET /foo HTTP/1.1" CRLF CRLF},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(accept_tests); i++) {
		struct accept_test accept_test = accept_tests[i];
		cio_server_socket_accept_fake.custom_fake = accept_test.accept_handler;

		free_dummy_client(client_socket);
		client_socket = accept_test.alloc_client();

		enum cio_error (*timer_init_fakes[])(struct cio_timer *timer, struct cio_eventloop *l, cio_timer_close_hook_t hook) = {
		    accept_test.response_timer_init,
		    accept_test.request_timer_init};

		cio_timer_init_fake.custom_fake = NULL;
		SET_CUSTOM_FAKE_SEQ(cio_timer_init, timer_init_fakes, ARRAY_SIZE(timer_init_fakes))

		cio_timer_expires_from_now_fake.custom_fake = accept_test.timer_expires;
		cio_buffered_stream_init_fake.return_val = accept_test.buffered_stream_init_return_val;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = accept_test.alloc_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		split_request(accept_test.request);
		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");

		if (accept_test.alloc_client != alloc_dummy_client_no_iostream) {
			TEST_ASSERT_EQUAL_MESSAGE(1, stream_close_fake.call_count, "stream was not closed!");
		}

		setUp();
	}

	free_dummy_client(client_socket);
}